

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

UpperTriangularLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_uppertriangular(NeuralNetworkLayer *this)

{
  bool bVar1;
  UpperTriangularLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_uppertriangular(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_uppertriangular(this);
    this_00 = (UpperTriangularLayerParams *)operator_new(0x20);
    UpperTriangularLayerParams::UpperTriangularLayerParams(this_00);
    (this->layer_).uppertriangular_ = this_00;
  }
  return (UpperTriangularLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::UpperTriangularLayerParams* NeuralNetworkLayer::mutable_uppertriangular() {
  if (!has_uppertriangular()) {
    clear_layer();
    set_has_uppertriangular();
    layer_.uppertriangular_ = new ::CoreML::Specification::UpperTriangularLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.upperTriangular)
  return layer_.uppertriangular_;
}